

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

int __thiscall cmCTestTestHandler::ProcessHandler(cmCTestTestHandler *this)

{
  pointer pcVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  NoTests NVar7;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  _Rb_tree_node_base *p_Var11;
  char *pcVar12;
  pointer this_00;
  char *name;
  undefined8 uVar13;
  basic_string_view<char,_std::char_traits<char>_> __str;
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  disabledTests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passed;
  cmDuration durationInSecs;
  ostringstream cmCTestLog_msg_1;
  cmGeneratedFileStream mLogFile;
  undefined1 local_488 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  undefined8 local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  undefined8 local_438;
  long local_430;
  long local_428;
  basic_string_view<char,_std::char_traits<char>_> local_420;
  undefined1 local_410 [16];
  _Base_ptr local_400;
  _Rb_tree_node_base *local_3f8;
  ios_base local_3a0 [264];
  undefined1 local_298 [616];
  
  bVar5 = ProcessOptions(this);
  iVar8 = -1;
  if (bVar5) {
    pcVar1 = (this->TestResults).
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (this->TestResults).
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = pcVar1;
    if (pcVar2 != pcVar1) {
      do {
        cmCTestTestResult::~cmCTestTestResult(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pcVar2);
      (this->TestResults).
      super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
    pcVar12 = "Memory check";
    name = "Test";
    if (this->MemCheck == false) {
      pcVar12 = "Test";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,pcVar12,(ulong)this->MemCheck * 8 + 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298," project ",9);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,(char *)local_410._0_8_,local_410._8_8_);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((_Base_ptr *)local_410._0_8_ != &local_400) {
      operator_delete((void *)local_410._0_8_,(ulong)((long)&local_400->_M_color + 1));
    }
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x1a0,(char *)local_410._0_8_,(this->super_cmCTestGenericHandler).Quiet);
    if ((_Base_ptr *)local_410._0_8_ != &local_400) {
      operator_delete((void *)local_410._0_8_,(ulong)((long)&local_400->_M_color + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    std::ios_base::~ios_base((ios_base *)(local_298 + 0x70));
    iVar6 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[6])(this);
    if (iVar6 != 0) {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
      if (this->MemCheck != false) {
        name = "DynamicAnalysis";
      }
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,name,(cmGeneratedFileStream *)local_298);
      this->LogFile = (ostream *)local_298;
      local_438 = 0;
      local_448._M_allocated_capacity = 0;
      local_448._8_8_ = (undefined8 *)0x0;
      local_458 = 0;
      local_468._M_allocated_capacity = 0;
      local_468._8_8_ = 0;
      lVar10 = std::chrono::_V2::steady_clock::now();
      bVar5 = ProcessDirectory(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_448,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_468);
      iVar8 = -1;
      if (bVar5) {
        local_428 = std::chrono::_V2::steady_clock::now();
        if (((long)(local_468._8_8_ - local_468._0_8_) >> 5) +
            ((long)(local_448._8_8_ - local_448._0_8_) >> 5) == 0) {
          bVar5 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
          iVar6 = 0;
          if (((!bVar5) &&
              (bVar5 = cmCTest::ShouldPrintLabels((this->super_cmCTestGenericHandler).CTest),
              iVar6 = 0, !bVar5)) &&
             (NVar7 = cmCTest::GetNoTestsMode((this->super_cmCTestGenericHandler).CTest),
             NVar7 != Ignore)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_410,"No tests were found!!!",0x16);
            std::endl<char,std::char_traits<char>>((ostream *)local_410);
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x1ba,(char *)local_488._0_8_,false);
            if ((pointer)local_488._0_8_ != (pointer)(local_488 + 0x10)) {
              operator_delete((void *)local_488._0_8_,
                              (ulong)((long)&(((string *)local_488._16_8_)->_M_dataplus)._M_p + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
            std::ios_base::~ios_base(local_3a0);
            NVar7 = cmCTest::GetNoTestsMode((this->super_cmCTestGenericHandler).CTest);
            iVar6 = -(uint)(NVar7 == Error);
          }
        }
        else {
          local_430 = lVar10;
          if (((local_448._M_allocated_capacity != local_448._8_8_) &&
              ((this->super_cmCTestGenericHandler).HandlerVerbose != OUTPUT_NONE)) &&
             ((this->UseIncludeRegExpFlag != false || (this->UseExcludeRegExpFlag == true)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
            poVar9 = std::endl<char,std::char_traits<char>>((ostream *)local_410);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"The following tests passed:",0x1b);
            std::endl<char,std::char_traits<char>>(poVar9);
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x1c5,(char *)local_488._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((pointer)local_488._0_8_ != (pointer)(local_488 + 0x10)) {
              operator_delete((void *)local_488._0_8_,
                              (ulong)((long)&(((string *)local_488._16_8_)->_M_dataplus)._M_p + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
            std::ios_base::~ios_base(local_3a0);
            uVar4 = local_448._8_8_;
            if (local_448._M_allocated_capacity != local_448._8_8_) {
              uVar13 = local_448._M_allocated_capacity;
              do {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_410,"\t",1);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_410,*(char **)uVar13,
                                    *(undefined8 *)(uVar13 + 8));
                std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                pcVar3 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                             ,0x1c8,(char *)local_488._0_8_,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((pointer)local_488._0_8_ != (pointer)(local_488 + 0x10)) {
                  operator_delete((void *)local_488._0_8_,
                                  (ulong)((long)&(((string *)local_488._16_8_)->_M_dataplus)._M_p +
                                         1));
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
                std::ios_base::~ios_base(local_3a0);
                uVar13 = uVar13 + 0x20;
              } while (uVar13 != uVar4);
            }
          }
          std::
          set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
          ::
          set<__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestResult*,std::vector<cmCTestTestHandler::cmCTestTestResult,std::allocator<cmCTestTestHandler::cmCTestTestResult>>>>
                    ((set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
                      *)local_410,
                     (this->TestResults).
                     super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->TestResults).
                     super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          local_488._0_8_ = (pointer)0x0;
          local_488._8_8_ = (pointer)0x0;
          local_488._16_8_ = (pointer)0x0;
          if (local_3f8 != (_Rb_tree_node_base *)(local_410 + 8)) {
            p_Var11 = local_3f8;
            do {
              local_420._M_str = *(char **)(p_Var11 + 8);
              local_420._M_len = (size_t)p_Var11[8]._M_parent;
              __str._M_str = "SKIP_";
              __str._M_len = 5;
              iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                (&local_420,0,5,__str);
              if ((iVar8 == 0) ||
                 (iVar8 = std::__cxx11::string::compare((char *)(p_Var11 + 8)), iVar8 == 0)) {
                std::
                vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                ::push_back((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                             *)local_488,(value_type *)(p_Var11 + 1));
              }
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
            } while (p_Var11 != (_Rb_tree_node_base *)(local_410 + 8));
          }
          local_420._M_len = (size_t)((double)(local_428 - local_430) / 1000000000.0);
          LogTestSummary(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_448,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_468,(cmDuration *)&local_420);
          LogDisabledTests(this,(vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                                 *)local_488);
          LogFailedTests(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_468,(SetOfTests *)local_410);
          std::
          vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ::~vector((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                     *)local_488);
          std::
          _Rb_tree<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResult,_std::_Identity<cmCTestTestHandler::cmCTestTestResult>,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ::~_Rb_tree((_Rb_tree<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResult,_std::_Identity<cmCTestTestHandler::cmCTestTestResult>,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                       *)local_410);
          iVar6 = 0;
        }
        bVar5 = GenerateXML(this);
        iVar8 = 1;
        if ((bVar5) && (bVar5 = WriteJUnitXML(this), bVar5)) {
          iVar8 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[7])(this);
          if (iVar8 == 0) {
            this->LogFile = (ostream *)0x0;
            iVar8 = -1;
          }
          else {
            this->LogFile = (ostream *)0x0;
            iVar8 = -1;
            if (local_468._M_allocated_capacity == local_468._8_8_) {
              iVar8 = iVar6;
            }
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_468);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_448);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    }
  }
  return iVar8;
}

Assistant:

int cmCTestTestHandler::ProcessHandler()
{
  if (!this->ProcessOptions()) {
    return -1;
  }

  this->TestResults.clear();

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     (this->MemCheck ? "Memory check" : "Test")
                       << " project "
                       << cmSystemTools::GetCurrentWorkingDirectory()
                       << std::endl,
                     this->Quiet);
  if (!this->PreProcessHandler()) {
    return -1;
  }

  cmGeneratedFileStream mLogFile;
  this->StartLogFile((this->MemCheck ? "DynamicAnalysis" : "Test"), mLogFile);
  this->LogFile = &mLogFile;

  std::vector<std::string> passed;
  std::vector<std::string> failed;

  // start the real time clock
  auto clock_start = std::chrono::steady_clock::now();

  if (!this->ProcessDirectory(passed, failed)) {
    return -1;
  }

  auto clock_finish = std::chrono::steady_clock::now();

  bool noTestsFoundError = false;
  if (passed.size() + failed.size() == 0) {
    if (!this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels() &&
        this->CTest->GetNoTestsMode() != cmCTest::NoTests::Ignore) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "No tests were found!!!" << std::endl);
      if (this->CTest->GetNoTestsMode() == cmCTest::NoTests::Error) {
        noTestsFoundError = true;
      }
    }
  } else {
    if (this->HandlerVerbose && !passed.empty() &&
        (this->UseIncludeRegExpFlag || this->UseExcludeRegExpFlag)) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         std::endl
                           << "The following tests passed:" << std::endl,
                         this->Quiet);
      for (std::string const& j : passed) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "\t" << j << std::endl, this->Quiet);
      }
    }

    SetOfTests resultsSet(this->TestResults.begin(), this->TestResults.end());
    std::vector<cmCTestTestHandler::cmCTestTestResult> disabledTests;

    for (cmCTestTestResult const& ft : resultsSet) {
      if (cmHasLiteralPrefix(ft.CompletionStatus, "SKIP_") ||
          ft.CompletionStatus == "Disabled") {
        disabledTests.push_back(ft);
      }
    }

    cmDuration durationInSecs = clock_finish - clock_start;
    this->LogTestSummary(passed, failed, durationInSecs);

    this->LogDisabledTests(disabledTests);

    this->LogFailedTests(failed, resultsSet);
  }

  if (!this->GenerateXML()) {
    return 1;
  }

  if (!this->WriteJUnitXML()) {
    return 1;
  }

  if (!this->PostProcessHandler()) {
    this->LogFile = nullptr;
    return -1;
  }

  if (!failed.empty()) {
    this->LogFile = nullptr;
    return -1;
  }

  if (noTestsFoundError) {
    this->LogFile = nullptr;
    return -1;
  }

  this->LogFile = nullptr;
  return 0;
}